

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_hash.cpp
# Opt level: O0

void duckdb::TemplatedLoopCombineHash<false,_duckdb::uhugeint_t>
               (Vector *input,Vector *hashes,SelectionVector *rsel,idx_t count)

{
  uhugeint_t input_00;
  VectorType VVar1;
  unsigned_long *puVar2;
  hash_t hVar3;
  Vector *in_RSI;
  Vector *in_RDI;
  Vector *unaff_retaddr;
  unsigned_long constant_hash;
  UnifiedVectorFormat idata;
  hash_t other_hash;
  unsigned_long *hash_data;
  uhugeint_t *ldata;
  UnifiedVectorFormat *in_stack_ffffffffffffff30;
  UnifiedVectorFormat *in_stack_ffffffffffffff40;
  undefined1 is_null;
  uint64_t in_stack_ffffffffffffff48;
  uint64_t in_stack_ffffffffffffff50;
  Vector *in_stack_ffffffffffffff60;
  SelectionVector *in_stack_ffffffffffffff88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff90;
  SelectionVector *in_stack_ffffffffffffff98;
  SelectionVector *in_stack_ffffffffffffffa0;
  element_type *in_stack_ffffffffffffffa8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffb0;
  ValidityMask *in_stack_ffffffffffffffc0;
  
  VVar1 = Vector::GetVectorType(in_RDI);
  if ((VVar1 == CONSTANT_VECTOR) &&
     (VVar1 = Vector::GetVectorType(in_RSI), VVar1 == CONSTANT_VECTOR)) {
    ConstantVector::GetData<duckdb::uhugeint_t>((Vector *)0x2d393fe);
    is_null = (undefined1)((ulong)in_stack_ffffffffffffff40 >> 0x38);
    puVar2 = ConstantVector::GetData<unsigned_long>((Vector *)0x2d39413);
    ConstantVector::IsNull((Vector *)0x2d39447);
    input_00.upper = in_stack_ffffffffffffff50;
    input_00.lower = in_stack_ffffffffffffff48;
    hVar3 = HashOp::Operation<duckdb::uhugeint_t>(input_00,(bool)is_null);
    hVar3 = CombineHashScalar(*puVar2,hVar3);
    *puVar2 = hVar3;
    return;
  }
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_ffffffffffffff40);
  Vector::ToUnifiedFormat(unaff_retaddr,(idx_t)in_RDI,(UnifiedVectorFormat *)in_RSI);
  VVar1 = Vector::GetVectorType(in_RSI);
  if (VVar1 == CONSTANT_VECTOR) {
    puVar2 = ConstantVector::GetData<unsigned_long>((Vector *)0x2d394e2);
    Vector::SetVectorType(in_stack_ffffffffffffff60,(VectorType)(*puVar2 >> 0x38));
    UnifiedVectorFormat::GetData<duckdb::uhugeint_t>
              ((UnifiedVectorFormat *)&stack0xffffffffffffff70);
    FlatVector::GetData<unsigned_long>((Vector *)0x2d39521);
    TightLoopCombineHashConstant<false,_duckdb::uhugeint_t>
              ((uhugeint_t *)in_stack_ffffffffffffffb0._M_pi,(hash_t)in_stack_ffffffffffffffa8,
               (hash_t *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (idx_t)in_stack_ffffffffffffff90._M_pi,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffffc0);
  }
  else {
    UnifiedVectorFormat::GetData<duckdb::uhugeint_t>
              ((UnifiedVectorFormat *)&stack0xffffffffffffff70);
    FlatVector::GetData<unsigned_long>((Vector *)0x2d3958d);
    TightLoopCombineHash<false,_duckdb::uhugeint_t>
              ((uhugeint_t *)in_stack_ffffffffffffffb0._M_pi,(hash_t *)in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0,(idx_t)in_stack_ffffffffffffff98,
               (SelectionVector *)in_stack_ffffffffffffff90._M_pi,
               (ValidityMask *)in_stack_ffffffffffffff88);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_ffffffffffffff30);
  return;
}

Assistant:

void TemplatedLoopCombineHash(Vector &input, Vector &hashes, const SelectionVector *rsel, idx_t count) {
	if (input.GetVectorType() == VectorType::CONSTANT_VECTOR && hashes.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		auto ldata = ConstantVector::GetData<T>(input);
		auto hash_data = ConstantVector::GetData<hash_t>(hashes);

		auto other_hash = HashOp::Operation(*ldata, ConstantVector::IsNull(input));
		*hash_data = CombineHashScalar(*hash_data, other_hash);
	} else {
		UnifiedVectorFormat idata;
		input.ToUnifiedFormat(count, idata);
		if (hashes.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			// mix constant with non-constant, first get the constant value
			auto constant_hash = *ConstantVector::GetData<hash_t>(hashes);
			// now re-initialize the hashes vector to an empty flat vector
			hashes.SetVectorType(VectorType::FLAT_VECTOR);
			TightLoopCombineHashConstant<HAS_RSEL, T>(UnifiedVectorFormat::GetData<T>(idata), constant_hash,
			                                          FlatVector::GetData<hash_t>(hashes), rsel, count, idata.sel,
			                                          idata.validity);
		} else {
			D_ASSERT(hashes.GetVectorType() == VectorType::FLAT_VECTOR);
			TightLoopCombineHash<HAS_RSEL, T>(UnifiedVectorFormat::GetData<T>(idata),
			                                  FlatVector::GetData<hash_t>(hashes), rsel, count, idata.sel,
			                                  idata.validity);
		}
	}
}